

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O1

rf_image *
rf_image_color_tint_to_buffer
          (rf_image *__return_storage_ptr__,rf_image image,rf_color color,void *dst,rf_int dst_size)

{
  undefined8 uVar1;
  int iVar2;
  rf_color rVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  void *src;
  long lVar7;
  undefined1 local_7c;
  undefined1 uStack_7b;
  undefined1 uStack_7a;
  undefined1 uStack_79;
  float local_78;
  float local_74;
  float local_70;
  float local_6c;
  long local_68;
  long local_60;
  void *local_58;
  rf_image *local_50;
  long local_48;
  long local_40;
  long local_38;
  
  __return_storage_ptr__->data = (void *)0x0;
  __return_storage_ptr__->width = 0;
  __return_storage_ptr__->height = 0;
  __return_storage_ptr__->format = 0;
  __return_storage_ptr__->valid = false;
  *(undefined3 *)&__return_storage_ptr__->field_0x15 = 0;
  if (image.valid == true) {
    local_68 = (long)image.width;
    local_60 = (long)image.height;
    iVar2 = rf_bits_per_pixel(image.format);
    iVar2 = iVar2 * image.height * image.width;
    iVar4 = iVar2 + 7;
    if (-1 < iVar2) {
      iVar4 = iVar2;
    }
    if (iVar4 >> 3 <= dst_size) {
      if (image.format - RF_UNCOMPRESSED_GRAYSCALE < 10) {
        lVar5 = *(long *)(&DAT_0017bfa8 + (ulong)(image.format - RF_UNCOMPRESSED_GRAYSCALE) * 8);
      }
      else {
        lVar5 = 0;
      }
      local_58 = dst;
      local_50 = __return_storage_ptr__;
      if (0 < (int)local_60) {
        local_6c = (float)((uint)color & 0xff) / 255.0;
        local_70 = (float)((uint)color >> 8 & 0xff) / 255.0;
        local_74 = (float)((uint)color >> 0x10 & 0xff) / 255.0;
        local_78 = (float)((uint)color >> 0x18) / 255.0;
        local_48 = lVar5 * local_68;
        lVar7 = 0;
        local_40 = 0;
        do {
          lVar6 = local_68;
          local_38 = lVar7;
          if (0 < (int)local_68) {
            do {
              src = (void *)((lVar7 >> 0x20) + (long)image.data);
              rVar3 = rf_format_one_pixel_to_rgba32(src,image.format);
              _local_7c = CONCAT13((char)(int)(((float)((uint)rVar3 >> 0x18) / 255.0) * local_78 *
                                              255.0),
                                   CONCAT12((char)(int)(((float)((uint)rVar3 >> 0x10 & 0xff) / 255.0
                                                        ) * local_74 * 255.0),
                                            CONCAT11((char)(int)(((float)((uint)rVar3 >> 8 & 0xff) /
                                                                 255.0) * local_70 * 255.0),
                                                     (char)(int)(((float)((uint)rVar3 & 0xff) /
                                                                 255.0) * local_6c * 255.0))));
              rf_format_one_pixel(&local_7c,RF_UNCOMPRESSED_R8G8B8A8,src,image.format);
              lVar7 = lVar7 + lVar5;
              lVar6 = lVar6 + -1;
            } while (lVar6 != 0);
          }
          local_40 = local_40 + 1;
          lVar7 = local_38 + local_48;
        } while (local_40 != local_60);
      }
      local_50->data = image.data;
      local_50->width = (int)image._8_8_;
      local_50->height = (int)((ulong)image._8_8_ >> 0x20);
      uVar1 = image._16_8_;
      local_50->format = (int)uVar1;
      local_50->valid = (_Bool)(char)((ulong)uVar1 >> 0x20);
      *(int3 *)&local_50->field_0x15 = (int3)((ulong)uVar1 >> 0x28);
      local_50->data = local_58;
      __return_storage_ptr__ = local_50;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_image rf_image_color_tint_to_buffer(rf_image image, rf_color color, void* dst, rf_int dst_size)
{
    rf_image result = {0};

    if (image.valid)
    {
        if (dst_size >= rf_image_size(image))
        {
            int bpp = rf_bytes_per_pixel(image.format);

            float c_r = ((float) color.r) / 255.0f;
            float c_g = ((float) color.g) / 255.0f;
            float c_b = ((float) color.b) / 255.0f;
            float c_a = ((float) color.a) / 255.0f;

            for (rf_int y = 0; y < image.height; y++)
            {
                for (rf_int x = 0; x < image.width; x++)
                {
                    int   index = y * image.width + x;
                    void* src_pixel = ((unsigned char*)image.data) + index * bpp;
                    void* dst_pixel = ((unsigned char*)image.data) + index * bpp;

                    rf_color pixel_rgba32 = rf_format_one_pixel_to_rgba32(src_pixel, image.format);

                    pixel_rgba32.r = (unsigned char) (255.f * (((float)pixel_rgba32.r) / 255.f * c_r));
                    pixel_rgba32.g = (unsigned char) (255.f * (((float)pixel_rgba32.g) / 255.f * c_g));
                    pixel_rgba32.b = (unsigned char) (255.f * (((float)pixel_rgba32.b) / 255.f * c_b));
                    pixel_rgba32.a = (unsigned char) (255.f * (((float)pixel_rgba32.a) / 255.f * c_a));

                    rf_format_one_pixel(&pixel_rgba32, RF_UNCOMPRESSED_R8G8B8A8, dst_pixel, image.format);
                }
            }

            result = image;
            result.data = dst;
        }
    }

    return result;
}